

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

Instr * IR::Instr::FindSingleDefInstr(OpCode opCode,Opnd *src)

{
  Instr *pIVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  
  OVar3 = Opnd::GetKind(src);
  if (OVar3 == OpndKindReg) {
    OVar3 = Opnd::GetKind(src);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    src = (Opnd *)0x0;
  }
  if ((src == (Opnd *)0x0) ||
     (pIVar1 = (Instr *)src[1]._vptr_Opnd[5],
     (pIVar1 != (Instr *)0x0 & *(byte *)(src[1]._vptr_Opnd + 3)) != 1)) {
    pIVar6 = (Instr *)0x0;
  }
  else {
    pIVar6 = (Instr *)0x0;
    if (pIVar1->m_opcode == opCode) {
      pIVar6 = pIVar1;
    }
  }
  return pIVar6;
}

Assistant:

Instr*
Instr::FindSingleDefInstr(Js::OpCode opCode, Opnd* src)
{
    RegOpnd* src1 = src->IsRegOpnd() ? src->AsRegOpnd() : nullptr;

    return  src1 &&
        src1->m_sym->IsSingleDef() &&
        src1->m_sym->GetInstrDef()->m_opcode == opCode ?
        src1->m_sym->GetInstrDef() :
        nullptr;
}